

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O2

void __thiscall
gepard::StrokePathBuilder::LineAttributes::set
          (LineAttributes *this,FloatPoint *from,FloatPoint *to,Float halfWidth)

{
  FloatPoint *this_00;
  bool bVar1;
  Float FVar2;
  double dVar3;
  double dVar4;
  FloatPoint FVar5;
  
  FVar2 = from->y;
  (this->location).x = from->x;
  (this->location).y = FVar2;
  FVar5 = operator-(to,from);
  this_00 = &this->vector;
  this->vector = FVar5;
  bVar1 = FloatPoint::isZero(this_00);
  if (bVar1) {
    return;
  }
  FVar2 = FloatPoint::length(this_00);
  this->length = FVar2;
  FVar5 = operator/(this_00,&this->length);
  this->unit = FVar5;
  dVar3 = FVar5.x * halfWidth;
  (this->thicknessOffsets).x = dVar3;
  dVar4 = halfWidth * FVar5.y;
  (this->thicknessOffsets).y = dVar4;
  FloatPoint::set(&this->startTop,dVar4 + from->x,from->y - dVar3);
  FloatPoint::set(&this->startBottom,from->x - (this->thicknessOffsets).y,
                  from->y + (this->thicknessOffsets).x);
  FloatPoint::set(&this->endBottom,to->x - (this->thicknessOffsets).y,
                  to->y + (this->thicknessOffsets).x);
  FloatPoint::set(&this->endTop,to->x + (this->thicknessOffsets).y,
                  to->y - (this->thicknessOffsets).x);
  return;
}

Assistant:

void StrokePathBuilder::LineAttributes::set(const FloatPoint& from, const FloatPoint& to, const Float halfWidth)
{
    location = from;
    vector = to - from;

    if (vector.isZero())
        return;

    length = vector.length();
    unit = vector / length;

    thicknessOffsets.x = halfWidth * unit.x;
    thicknessOffsets.y = halfWidth * unit.y;

    startTop.set(from.x + thicknessOffsets.y, from.y - thicknessOffsets.x);
    startBottom.set(from.x - thicknessOffsets.y, from.y + thicknessOffsets.x);
    endBottom.set(to.x - thicknessOffsets.y, to.y + thicknessOffsets.x);
    endTop.set(to.x + thicknessOffsets.y, to.y - thicknessOffsets.x);
}